

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

void init_connection(mg_connection *conn)

{
  int iVar1;
  void *local_20;
  void *conn_data;
  mg_connection *pmStack_10;
  int keep_alive_enabled;
  mg_connection *conn_local;
  
  pmStack_10 = conn;
  iVar1 = mg_strcasecmp(conn->dom_ctx->config[10],"yes");
  conn_data._4_4_ = (uint)((iVar1 != 0 ^ 0xffU) & 1);
  if (conn_data._4_4_ == 0) {
    pmStack_10->must_close = 1;
  }
  pmStack_10->data_len = 0;
  pmStack_10->handled_requests = 0;
  pmStack_10->connection_type = 0;
  (pmStack_10->request_info).acceptedWebSocketSubprotocol = (char *)0x0;
  mg_set_user_connection_data(pmStack_10,(void *)0x0);
  if (((pmStack_10->phys_ctx->callbacks).init_connection !=
       (_func_int_mg_connection_ptr_void_ptr_ptr *)0x0) && (pmStack_10->phys_ctx->context_type == 1)
     ) {
    local_20 = (void *)0x0;
    (*(pmStack_10->phys_ctx->callbacks).init_connection)(pmStack_10,&local_20);
    mg_set_user_connection_data(pmStack_10,local_20);
  }
  return;
}

Assistant:

static void
init_connection(struct mg_connection *conn)
{
	/* Is keep alive allowed by the server */
	int keep_alive_enabled =
	    !mg_strcasecmp(conn->dom_ctx->config[ENABLE_KEEP_ALIVE], "yes");

	if (!keep_alive_enabled) {
		conn->must_close = 1;
	}

	/* Important: on new connection, reset the receiving buffer. Credit
	 * goes to crule42. */
	conn->data_len = 0;
	conn->handled_requests = 0;
	conn->connection_type = CONNECTION_TYPE_INVALID;
	conn->request_info.acceptedWebSocketSubprotocol = NULL;
	mg_set_user_connection_data(conn, NULL);

#if defined(USE_SERVER_STATS)
	conn->conn_state = 2; /* init */
#endif

	/* call the init_connection callback if assigned */
	if (conn->phys_ctx->callbacks.init_connection != NULL) {
		if (conn->phys_ctx->context_type == CONTEXT_SERVER) {
			void *conn_data = NULL;
			conn->phys_ctx->callbacks.init_connection(conn, &conn_data);
			mg_set_user_connection_data(conn, conn_data);
		}
	}
}